

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlagsy.c
# Opt level: O2

int zlagsy_slu(int *n,int *k,double *d,doublecomplex *a,int *lda,int *iseed,doublecomplex *work,
              int *info)

{
  double dVar1;
  doublecomplex dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  int *lda_00;
  uint *puVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  doublecomplex *pdVar17;
  int iVar18;
  ulong unaff_RBX;
  long lVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  uint uVar26;
  uint *puVar27;
  int iVar28;
  double *pdVar29;
  int iVar30;
  double *pdVar31;
  int iVar32;
  long lVar33;
  uint uVar34;
  uint unaff_R14D;
  doublecomplex *pdVar35;
  long lVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  uint uVar39;
  uint local_114;
  int local_110;
  uint local_10c;
  doublecomplex local_108;
  uint *local_f0;
  doublecomplex *local_e8;
  uint local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  doublecomplex *local_b8;
  int *local_b0;
  long local_a8;
  ulong local_a0;
  uint *local_98;
  long local_90;
  double local_88;
  undefined8 uStack_80;
  doublecomplex local_78;
  ulong local_68;
  doublecomplex *local_60;
  long local_58;
  doublecomplex *local_50;
  double *local_48;
  ulong local_40;
  int *local_38;
  
  iVar32 = *lda;
  local_68 = (ulong)iVar32;
  *info = 0;
  uVar39 = *n;
  local_b8 = a;
  local_b0 = lda;
  local_38 = iseed;
  if ((int)uVar39 < 0) {
    local_110 = 1;
    iVar32 = -1;
  }
  else if ((uint)*k < uVar39) {
    if ((int)uVar39 <= *lda) {
      local_40 = ~local_68;
      local_58 = local_40 * 0x10;
      local_e8 = a + local_40;
      uVar21 = iVar32 + 2;
      iVar28 = 2;
      for (iVar25 = 1; uVar16 = *n, uVar26 = uVar21, iVar14 = iVar28, iVar25 != uVar39 + 1;
          iVar25 = iVar25 + 1) {
        for (; iVar14 + -1 < (int)uVar16; iVar14 = iVar14 + 1) {
          local_e8[(int)uVar26].r = 0.0;
          local_e8[(int)uVar26].i = 0.0;
          unaff_RBX = (ulong)uVar26;
          uVar26 = uVar26 + 1;
        }
        iVar28 = iVar28 + 1;
        uVar21 = uVar21 + iVar32 + 1;
        unaff_R14D = uVar16;
      }
      local_dc = iVar32 + 1;
      uVar15 = 0;
      uVar39 = local_dc;
      uVar11 = (ulong)uVar16;
      if ((int)uVar16 < 1) {
        uVar11 = uVar15;
      }
      while (uVar21 = uVar39, uVar11 != uVar15) {
        local_e8[(int)uVar21].r = d[uVar15];
        local_e8[(int)uVar21].i = 0.0;
        uVar15 = uVar15 + 1;
        unaff_RBX = uVar15 & 0xffffffff;
        uVar39 = uVar21 + local_dc;
        unaff_R14D = uVar21;
      }
      local_10c = (uint)unaff_RBX;
      local_50 = work + 1;
      uVar11 = (ulong)(uint)*n;
      local_60 = work;
      local_48 = &work->i;
      local_c8._0_4_ = iVar32 + 1;
      local_a8 = local_68 * 0x10 + 0x10;
      local_f0 = (uint *)n;
      local_98 = (uint *)k;
      while( true ) {
        puVar27 = local_f0;
        iVar32 = (int)uVar11;
        zlagsy_slu::i = iVar32 + -1;
        if (iVar32 < 2) break;
        local_110 = (*local_f0 - iVar32) + 2;
        zlarnv_slu(&c__3,local_38,&local_110,work);
        local_110 = (*puVar27 - zlagsy_slu::i) + 1;
        zlagsy_slu::wn = dznrm2_(&local_110,work,&c__1);
        local_d8._8_4_ = extraout_XMM0_Dc;
        local_d8._0_8_ = zlagsy_slu::wn;
        local_d8._12_4_ = extraout_XMM0_Dd;
        dVar3 = z_abs(work);
        local_108.r = ((double)local_d8._0_8_ / dVar3) * work->r;
        local_108.i = ((double)local_d8._0_8_ / dVar3) * work->i;
        zlagsy_slu::wa.i = local_108.i;
        zlagsy_slu::wa.r = local_108.r;
        uVar37 = 0;
        uVar38 = 0;
        if ((zlagsy_slu::wn != 0.0) || (NAN(zlagsy_slu::wn))) {
          local_108.r = local_108.r + work->r;
          local_108.i = local_108.i + work->i;
          zlagsy_slu::wb.i = local_108.i;
          zlagsy_slu::wb.r = local_108.r;
          local_110 = *local_f0 - zlagsy_slu::i;
          z_div(&local_108,&c_b2,&zlagsy_slu::wb);
          zscal_(&local_110,&local_108,local_50,&c__1);
          work->r = 1.0;
          work->i = 0.0;
          z_div(&local_108,&zlagsy_slu::wb,&zlagsy_slu::wa);
          uVar37 = SUB84(local_108.r,0);
          uVar38 = (undefined4)((ulong)local_108.r >> 0x20);
        }
        puVar27 = local_f0;
        zlagsy_slu::tau.r = (double)CONCAT44(uVar38,uVar37);
        zlagsy_slu::tau.i = 0.0;
        local_110 = (*local_f0 - zlagsy_slu::i) + 1;
        zlacgv_slu(&local_110,work,&c__1);
        local_110 = (*puVar27 - zlagsy_slu::i) + 1;
        zsymv_("Lower",&local_110,&zlagsy_slu::tau,local_e8 + (int)(zlagsy_slu::i * local_dc),
               local_b0,work,&c__1,&c_b1,work + (int)*puVar27,&c__1);
        local_110 = (*puVar27 - zlagsy_slu::i) + 1;
        zlacgv_slu(&local_110,work,&c__1);
        local_d8._8_8_ = 0;
        local_d8._0_8_ = zlagsy_slu::tau.r * -0.5 + zlagsy_slu::tau.i * -0.0;
        local_88 = zlagsy_slu::tau.i * -0.5 + zlagsy_slu::tau.r * 0.0;
        uStack_80 = 0;
        local_110 = (*puVar27 - zlagsy_slu::i) + 1;
        zdotc_(&local_78,&local_110,work,&c__1,work + (int)*puVar27,&c__1);
        local_108.r = (double)local_d8._0_8_ * local_78.r + local_78.i * -local_88;
        local_108.i = (double)local_d8._0_8_ * local_78.i + local_78.r * local_88;
        zlagsy_slu::alpha.i = local_108.i;
        zlagsy_slu::alpha.r = local_108.r;
        local_110 = (*puVar27 - zlagsy_slu::i) + 1;
        zaxpy_(&local_110,&zlagsy_slu::alpha,work,&c__1,work + (int)*puVar27,&c__1);
        uVar39 = *puVar27;
        uVar11 = (ulong)(uint)zlagsy_slu::i;
        local_88 = (double)(ulong)(uVar39 - zlagsy_slu::i);
        local_90 = (long)zlagsy_slu::i;
        uVar16 = local_c8._0_4_ * zlagsy_slu::i;
        pdVar29 = (double *)((long)&local_e8->r + local_a8 * local_90);
        local_d8._0_4_ = uVar39;
        pdVar31 = local_48;
        uVar21 = uVar39;
        local_114 = unaff_R14D;
        for (lVar20 = local_90; lVar20 <= (int)uVar39; lVar20 = lVar20 + 1) {
          lVar33 = 0;
          uVar26 = uVar16;
          uVar34 = uVar21;
          for (lVar12 = lVar20; uVar15 = (ulong)uVar26, lVar12 <= (int)uVar39; lVar12 = lVar12 + 1)
          {
            dVar3 = *(double *)((long)pdVar31 + lVar33 + -8);
            dVar1 = local_60[lVar20 - local_90].r;
            dVar4 = local_60[lVar20 - local_90].i;
            local_108.r = work[(int)uVar34].r * dVar1 + dVar4 * -work[(int)uVar34].i;
            local_108.i = work[(int)uVar34].r * dVar4 + dVar1 * work[(int)uVar34].i;
            local_78.i._0_4_ = SUB84(local_108.i,0);
            local_78.r = local_108.r;
            local_78.i._4_4_ = (int)((ulong)local_108.i >> 0x20);
            dVar1 = local_60[(int)((uVar39 - zlagsy_slu::i) + (int)lVar20)].r;
            dVar4 = local_60[(int)((uVar39 - zlagsy_slu::i) + (int)lVar20)].i;
            local_108.r = (*(double *)((long)pdVar29 + lVar33) -
                          (dVar3 * dVar1 + dVar4 * -*(double *)((long)pdVar31 + lVar33))) -
                          local_108.r;
            local_108.i = (((double *)((long)pdVar29 + lVar33))[1] -
                          (dVar3 * dVar4 + dVar1 * *(double *)((long)pdVar31 + lVar33))) -
                          local_108.i;
            *(double *)((long)pdVar29 + lVar33) = local_108.r;
            ((double *)((long)pdVar29 + lVar33))[1] = local_108.i;
            uVar34 = uVar34 + 1;
            lVar33 = lVar33 + 0x10;
            uVar26 = uVar26 + 1;
            unaff_RBX = uVar15;
          }
          uVar21 = uVar21 + 1;
          pdVar31 = pdVar31 + 2;
          uVar16 = uVar16 + local_c8._0_4_;
          pdVar29 = (double *)((long)pdVar29 + local_a8);
          local_114 = uVar39;
        }
        local_10c = (uint)unaff_RBX;
        local_a0 = uVar11;
        unaff_R14D = local_114;
      }
      local_110 = *local_f0 + ~*local_98;
      local_90 = (long)&local_b8->i + local_58;
      local_b8 = local_b8 + 1;
      local_a0 = CONCAT44(local_a0._4_4_,(int)local_68 + 1);
      zlagsy_slu::i = 1;
      uVar11 = local_68;
      while( true ) {
        puVar10 = local_98;
        pdVar17 = local_e8;
        puVar27 = local_f0;
        uVar39 = *local_f0;
        iVar32 = (int)uVar11;
        if (local_110 < zlagsy_slu::i) break;
        local_114 = (uVar39 - (*local_98 + zlagsy_slu::i)) + 1;
        zlagsy_slu::wn =
             dznrm2_((integer *)&local_114,
                     local_e8 + (int)(zlagsy_slu::i * iVar32 + *local_98 + zlagsy_slu::i),&c__1);
        local_c8._8_4_ = extraout_XMM0_Dc_00;
        local_c8._0_8_ = zlagsy_slu::wn;
        local_c8._12_4_ = extraout_XMM0_Dd_00;
        dVar3 = z_abs(pdVar17 + (int)(zlagsy_slu::i * iVar32 + *puVar10 + zlagsy_slu::i));
        uVar39 = *puVar10;
        iVar25 = zlagsy_slu::i + uVar39;
        lVar20 = (long)(zlagsy_slu::i * iVar32 + iVar25);
        local_108.r = ((double)local_c8._0_8_ / dVar3) * pdVar17[lVar20].r;
        local_108.i = ((double)local_c8._0_8_ / dVar3) * pdVar17[lVar20].i;
        zlagsy_slu::wa.i = local_108.i;
        zlagsy_slu::wa.r = local_108.r;
        uVar37 = 0;
        uVar38 = 0;
        if ((zlagsy_slu::wn != 0.0) || (NAN(zlagsy_slu::wn))) {
          local_108.r = local_108.r + pdVar17[lVar20].r;
          local_108.i = local_108.i + pdVar17[lVar20].i;
          zlagsy_slu::wb.i = local_108.i;
          zlagsy_slu::wb.r = local_108.r;
          local_114 = *puVar27 - iVar25;
          z_div(&local_108,&c_b2,&zlagsy_slu::wb);
          zscal_((integer *)&local_114,&local_108,
                 pdVar17 + (int)(zlagsy_slu::i + *puVar10 + zlagsy_slu::i * iVar32 + 1),&c__1);
          local_114 = zlagsy_slu::i * iVar32 + *puVar10 + zlagsy_slu::i;
          pdVar17[(int)local_114].r = 1.0;
          pdVar17[(int)local_114].i = 0.0;
          z_div(&local_108,&zlagsy_slu::wb,&zlagsy_slu::wa);
          uVar37 = local_108.r._0_4_;
          uVar38 = local_108.r._4_4_;
          uVar39 = *puVar10;
          iVar25 = zlagsy_slu::i + uVar39;
          lVar20 = (long)(zlagsy_slu::i * iVar32 + iVar25);
          puVar27 = local_f0;
        }
        lda_00 = local_b0;
        zlagsy_slu::tau.r = (double)CONCAT44(uVar38,uVar37);
        zlagsy_slu::tau.i = 0.0;
        local_114 = (*puVar27 - iVar25) + 1;
        local_10c = uVar39 - 1;
        zgemv_("Conjugate transpose",(integer *)&local_114,(integer *)&local_10c,&c_b2,
               pdVar17 + ((zlagsy_slu::i + 1) * iVar32 + iVar25),local_b0,pdVar17 + lVar20,&c__1,
               &c_b1,work,&c__1);
        puVar10 = local_98;
        iVar25 = zlagsy_slu::i + *local_98;
        local_114 = (*puVar27 - iVar25) + 1;
        local_10c = *local_98 - 1;
        local_108.r = -zlagsy_slu::tau.r;
        local_108.i._0_4_ = SUB84(zlagsy_slu::tau.i,0);
        local_108.i._4_4_ = (uint)((ulong)zlagsy_slu::tau.i >> 0x20) ^ 0x80000000;
        zgerc_((integer *)&local_114,(integer *)&local_10c,&local_108,
               pdVar17 + (zlagsy_slu::i * iVar32 + iVar25),&c__1,work,&c__1,
               pdVar17 + ((zlagsy_slu::i + 1) * iVar32 + iVar25),lda_00);
        puVar27 = local_f0;
        local_114 = (*local_f0 - (*puVar10 + zlagsy_slu::i)) + 1;
        zlacgv_slu((int *)&local_114,
                   pdVar17 + (int)(zlagsy_slu::i * iVar32 + *puVar10 + zlagsy_slu::i),&c__1);
        iVar25 = *puVar10 + zlagsy_slu::i;
        local_114 = (*puVar27 - iVar25) + 1;
        zsymv_("Lower",(int *)&local_114,&zlagsy_slu::tau,pdVar17 + (int)(iVar25 * local_dc),
               local_b0,pdVar17 + (zlagsy_slu::i * iVar32 + iVar25),&c__1,&c_b1,work,&c__1);
        local_114 = (*puVar27 - (*puVar10 + zlagsy_slu::i)) + 1;
        zlacgv_slu((int *)&local_114,
                   pdVar17 + (int)(zlagsy_slu::i * iVar32 + *puVar10 + zlagsy_slu::i),&c__1);
        local_c8._8_8_ = 0;
        local_c8._0_8_ = zlagsy_slu::tau.r * -0.5 + zlagsy_slu::tau.i * -0.0;
        local_d8._8_8_ = 0;
        local_d8._0_8_ = zlagsy_slu::tau.i * -0.5 + zlagsy_slu::tau.r * 0.0;
        local_114 = (*puVar27 - (*puVar10 + zlagsy_slu::i)) + 1;
        zdotc_(&local_78,(integer *)&local_114,
               pdVar17 + (int)(zlagsy_slu::i * iVar32 + *puVar10 + zlagsy_slu::i),&c__1,work,&c__1);
        local_108.r = (double)local_c8._0_8_ * local_78.r + local_78.i * -(double)local_d8._0_8_;
        local_108.i = (double)local_c8._0_8_ * local_78.i + local_78.r * (double)local_d8._0_8_;
        zlagsy_slu::alpha.i = local_108.i;
        zlagsy_slu::alpha.r = local_108.r;
        local_114 = (*puVar27 - (*puVar10 + zlagsy_slu::i)) + 1;
        zaxpy_((integer *)&local_114,&zlagsy_slu::alpha,
               pdVar17 + (int)(zlagsy_slu::i * iVar32 + *puVar10 + zlagsy_slu::i),&c__1,work,&c__1);
        auVar9 = local_d8;
        uVar39 = *puVar27;
        uVar21 = *puVar10;
        local_88 = (double)(ulong)uVar21;
        local_d8._4_4_ = 0;
        local_d8._0_4_ = zlagsy_slu::i;
        iVar25 = zlagsy_slu::i + uVar21;
        local_d8._8_8_ = auVar9._8_8_;
        lVar12 = (long)iVar25;
        lVar33 = (long)(zlagsy_slu::i * iVar32);
        local_c8._0_4_ = uVar39;
        lVar23 = (long)(int)uVar39;
        pdVar31 = (double *)((long)&pdVar17->r + local_a8 * lVar12);
        lVar19 = lVar12 * 0x10 + local_90 + lVar33 * 0x10;
        lVar24 = 0;
        pdVar35 = pdVar17;
        for (lVar20 = lVar12; lVar20 <= lVar23; lVar20 = lVar20 + 1) {
          lVar13 = 0;
          for (lVar36 = lVar24; lVar12 + lVar36 <= lVar23; lVar36 = lVar36 + 1) {
            dVar3 = *(double *)(lVar19 + -8 + lVar13);
            dVar1 = *(double *)(lVar19 + lVar13);
            dVar5 = pdVar17[lVar33 + lVar20].r;
            dVar6 = pdVar17[lVar33 + lVar20].i;
            dVar4 = work[(int)lVar36].r * dVar5 + dVar6 * -work[(int)lVar36].i;
            dVar5 = work[(int)lVar36].r * dVar6 + dVar5 * work[(int)lVar36].i;
            local_78.i._0_4_ = SUB84(dVar5,0);
            local_78.r = dVar4;
            local_78.i._4_4_ = (int)((ulong)dVar5 >> 0x20);
            dVar6 = local_60[(int)lVar20 - iVar25].r;
            dVar7 = local_60[(int)lVar20 - iVar25].i;
            dVar8 = ((double *)((long)pdVar31 + lVar13))[1];
            *(double *)((long)pdVar31 + lVar13) =
                 (*(double *)((long)pdVar31 + lVar13) - (dVar3 * dVar6 + dVar7 * -dVar1)) - dVar4;
            ((double *)((long)pdVar31 + lVar13))[1] =
                 (dVar8 - (dVar3 * dVar7 + dVar6 * dVar1)) - dVar5;
            lVar13 = lVar13 + 0x10;
          }
          pdVar31 = (double *)((long)pdVar31 + local_a8);
          lVar19 = lVar19 + 0x10;
          lVar24 = lVar24 + 1;
          uVar11 = local_68;
          pdVar35 = local_e8;
          local_10c = uVar39;
        }
        uVar39 = zlagsy_slu::wa.i._4_4_ ^ 0x80000000;
        local_108.i._0_4_ = zlagsy_slu::wa.i._0_4_;
        local_108.r = -zlagsy_slu::wa.r;
        local_108.i._4_4_ = uVar39;
        dVar2.i._0_4_ = zlagsy_slu::wa.i._0_4_;
        dVar2.r = -zlagsy_slu::wa.r;
        dVar2.i._4_4_ = uVar39;
        pdVar35[iVar25 + zlagsy_slu::i * iVar32] = dVar2;
        pdVar17 = local_b8 + lVar33 + local_40 + lVar12;
        uVar21 = (int)local_a0 * zlagsy_slu::i + uVar21;
        for (; uVar21 = uVar21 + 1, lVar12 < lVar23; lVar12 = lVar12 + 1) {
          pdVar17->r = 0.0;
          pdVar17->i = 0.0;
          pdVar17 = pdVar17 + 1;
          local_10c = uVar21;
        }
        zlagsy_slu::i = zlagsy_slu::i + 1;
      }
      uVar21 = 0;
      if (0 < (int)uVar39) {
        uVar21 = uVar39;
      }
      iVar14 = iVar32 + 2;
      iVar22 = iVar32 * 2 + 1;
      iVar28 = 2;
      for (iVar25 = 1; iVar25 != uVar21 + 1; iVar25 = iVar25 + 1) {
        uVar39 = *local_f0;
        iVar18 = iVar14;
        iVar30 = iVar22;
        for (zlagsy_slu::i = iVar28; zlagsy_slu::i + -1 < (int)uVar39;
            zlagsy_slu::i = zlagsy_slu::i + 1) {
          dVar3 = local_e8[iVar18].i;
          local_e8[iVar30].r = local_e8[iVar18].r;
          local_e8[iVar30].i = dVar3;
          iVar18 = iVar18 + 1;
          iVar30 = iVar30 + iVar32;
        }
        iVar28 = iVar28 + 1;
        iVar14 = iVar14 + iVar32 + 1;
        iVar22 = iVar22 + iVar32 + 1;
      }
      return 0;
    }
    local_110 = 5;
    iVar32 = -5;
  }
  else {
    local_110 = 2;
    iVar32 = -2;
  }
  *info = iVar32;
  input_error("ZLAGSY",&local_110);
  return 0;
}

Assistant:

int zlagsy_slu(int *n, int *k, double *d,
	doublecomplex *a, int *lda, int *iseed, doublecomplex *work,
	int *info)
{
    /* System generated locals */
    int a_dim1, a_offset, i__1, i__2, i__3, i__4, i__5, i__6, i__7, i__8,
	    i__9;
    double d__1;
    doublecomplex z__1, z__2, z__3, z__4;

    /* Local variables */
    static int i, j;
    static doublecomplex alpha;
    extern /* Subroutine */ int zgerc_(int *, int *, doublecomplex *,
	    doublecomplex *, int *, doublecomplex *, int *,
	    doublecomplex *, int *), zscal_(int *, doublecomplex *,
	    doublecomplex *, int *);
    extern /* Double Complex */ void zdotc_(doublecomplex *, int *,
	    doublecomplex *, int *, doublecomplex *, int *);
    extern /* Subroutine */ int	zsymv_(char *, int *,
	    doublecomplex *, doublecomplex *, int *, doublecomplex *,
	    int *, doublecomplex *, doublecomplex *, int *);
    extern double dznrm2_(int *, doublecomplex *, int *);
    static int ii, jj;
    static doublecomplex wa, wb;
    static double wn;
    extern /* Subroutine */ int zlacgv_slu(int *, doublecomplex *, int *), zlarnv_slu(int *,
	    int *, int *, doublecomplex *);
    extern int input_error(char *, int *);
    static doublecomplex tau;


/*  -- LAPACK auxiliary test routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       September 30, 1994   


    Purpose   
    =======   

    ZLAGSY generates a complex symmetric matrix A, by pre- and post-   
    multiplying a real diagonal matrix D with a random unitary matrix:   
    A = U*D*U**T. The semi-bandwidth may then be reduced to k by   
    additional unitary transformations.   

    Arguments   
    =========   

    N       (input) INTEGER   
            The order of the matrix A.  N >= 0.   

    K       (input) INTEGER   
            The number of nonzero subdiagonals within the band of A.   
            0 <= K <= N-1.   

    D       (input) DOUBLE PRECISION array, dimension (N)   
            The diagonal elements of the diagonal matrix D.   

    A       (output) COMPLEX*16 array, dimension (LDA,N)   
            The generated n by n symmetric matrix A (the full matrix is   
            stored).   

    LDA     (input) INTEGER   
            The leading dimension of the array A.  LDA >= N.   

    ISEED   (input/output) INTEGER array, dimension (4)   
            On entry, the seed of the random number generator; the array 
  
            elements must be between 0 and 4095, and ISEED(4) must be   
            odd.   
            On exit, the seed is updated.   

    WORK    (workspace) COMPLEX*16 array, dimension (2*N)   

    INFO    (output) INTEGER   
            = 0: successful exit   
            < 0: if INFO = -i, the i-th argument had an illegal value   

    ===================================================================== 
  


       Test the input arguments   

       Parameter adjustments */
    --d;
    a_dim1 = *lda;
    a_offset = a_dim1 + 1;
    a -= a_offset;
    --iseed;
    --work;

    /* Function Body */
    *info = 0;
    if (*n < 0) {
	*info = -1;
    } else if (*k < 0 || *k > *n - 1) {
	*info = -2;
    } else if (*lda < SUPERLU_MAX(1,*n)) {
	*info = -5;
    }
    if (*info < 0) {
	i__1 = -(*info);
	input_error("ZLAGSY", &i__1);
	return 0;
    }

/*     initialize lower triangle of A to diagonal matrix */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *n;
	for (i = j + 1; i <= i__2; ++i) {
	    i__3 = i + j * a_dim1;
	    a[i__3].r = 0., a[i__3].i = 0.;
/* L10: */
	}
/* L20: */
    }
    i__1 = *n;
    for (i = 1; i <= i__1; ++i) {
	i__2 = i + i * a_dim1;
	i__3 = i;
	a[i__2].r = d[i__3], a[i__2].i = 0.;
/* L30: */
    }

/*     Generate lower triangle of symmetric matrix */

    for (i = *n - 1; i >= 1; --i) {

/*        generate random reflection */

	i__1 = *n - i + 1;
	zlarnv_slu(&c__3, &iseed[1], &i__1, &work[1]);
	i__1 = *n - i + 1;
	wn = dznrm2_(&i__1, &work[1], &c__1);
	d__1 = wn / z_abs(&work[1]);
	z__1.r = d__1 * work[1].r, z__1.i = d__1 * work[1].i;
	wa.r = z__1.r, wa.i = z__1.i;
	if (wn == 0.) {
	    tau.r = 0., tau.i = 0.;
	} else {
	    z__1.r = work[1].r + wa.r, z__1.i = work[1].i + wa.i;
	    wb.r = z__1.r, wb.i = z__1.i;
	    i__1 = *n - i;
	    z_div(&z__1, &c_b2, &wb);
	    zscal_(&i__1, &z__1, &work[2], &c__1);
	    work[1].r = 1., work[1].i = 0.;
	    z_div(&z__1, &wb, &wa);
	    d__1 = z__1.r;
	    tau.r = d__1, tau.i = 0.;
	}

/*        apply random reflection to A(i:n,i:n) from the left   
          and the right   

          compute  y := tau * A * conjg(u) */

	i__1 = *n - i + 1;
	zlacgv_slu(&i__1, &work[1], &c__1);
	i__1 = *n - i + 1;
	zsymv_("Lower", &i__1, &tau, &a[i + i * a_dim1], lda, &work[1], &c__1,
		 &c_b1, &work[*n + 1], &c__1);
	i__1 = *n - i + 1;
	zlacgv_slu(&i__1, &work[1], &c__1);

/*        compute  v := y - 1/2 * tau * ( u, y ) * u */

	z__3.r = -.5, z__3.i = 0.;
	z__2.r = z__3.r * tau.r - z__3.i * tau.i, z__2.i = z__3.r * tau.i + 
		z__3.i * tau.r;
	i__1 = *n - i + 1;
	zdotc_(&z__4, &i__1, &work[1], &c__1, &work[*n + 1], &c__1);
	z__1.r = z__2.r * z__4.r - z__2.i * z__4.i, z__1.i = z__2.r * z__4.i 
		+ z__2.i * z__4.r;
	alpha.r = z__1.r, alpha.i = z__1.i;
	i__1 = *n - i + 1;
	zaxpy_(&i__1, &alpha, &work[1], &c__1, &work[*n + 1], &c__1);

/*        apply the transformation as a rank-2 update to A(i:n,i:n)   

          CALL ZSYR2( 'Lower', N-I+1, -ONE, WORK, 1, WORK( N+1 ), 1, 
  
          $               A( I, I ), LDA ) */

	i__1 = *n;
	for (jj = i; jj <= i__1; ++jj) {
	    i__2 = *n;
	    for (ii = jj; ii <= i__2; ++ii) {
		i__3 = ii + jj * a_dim1;
		i__4 = ii + jj * a_dim1;
		i__5 = ii - i + 1;
		i__6 = *n + jj - i + 1;
		z__3.r = work[i__5].r * work[i__6].r - work[i__5].i * work[
			i__6].i, z__3.i = work[i__5].r * work[i__6].i + work[
			i__5].i * work[i__6].r;
		z__2.r = a[i__4].r - z__3.r, z__2.i = a[i__4].i - z__3.i;
		i__7 = *n + ii - i + 1;
		i__8 = jj - i + 1;
		z__4.r = work[i__7].r * work[i__8].r - work[i__7].i * work[
			i__8].i, z__4.i = work[i__7].r * work[i__8].i + work[
			i__7].i * work[i__8].r;
		z__1.r = z__2.r - z__4.r, z__1.i = z__2.i - z__4.i;
		a[i__3].r = z__1.r, a[i__3].i = z__1.i;
/* L40: */
	    }
/* L50: */
	}
/* L60: */
    }

/*     Reduce number of subdiagonals to K */

    i__1 = *n - 1 - *k;
    for (i = 1; i <= i__1; ++i) {

/*        generate reflection to annihilate A(k+i+1:n,i) */

	i__2 = *n - *k - i + 1;
	wn = dznrm2_(&i__2, &a[*k + i + i * a_dim1], &c__1);
	d__1 = wn / z_abs(&a[*k + i + i * a_dim1]);
	i__2 = *k + i + i * a_dim1;
	z__1.r = d__1 * a[i__2].r, z__1.i = d__1 * a[i__2].i;
	wa.r = z__1.r, wa.i = z__1.i;
	if (wn == 0.) {
	    tau.r = 0., tau.i = 0.;
	} else {
	    i__2 = *k + i + i * a_dim1;
	    z__1.r = a[i__2].r + wa.r, z__1.i = a[i__2].i + wa.i;
	    wb.r = z__1.r, wb.i = z__1.i;
	    i__2 = *n - *k - i;
	    z_div(&z__1, &c_b2, &wb);
	    zscal_(&i__2, &z__1, &a[*k + i + 1 + i * a_dim1], &c__1);
	    i__2 = *k + i + i * a_dim1;
	    a[i__2].r = 1., a[i__2].i = 0.;
	    z_div(&z__1, &wb, &wa);
	    d__1 = z__1.r;
	    tau.r = d__1, tau.i = 0.;
	}

/*        apply reflection to A(k+i:n,i+1:k+i-1) from the left */

	i__2 = *n - *k - i + 1;
	i__3 = *k - 1;
	zgemv_("Conjugate transpose", &i__2, &i__3, &c_b2, &a[*k + i + (i + 1)
		 * a_dim1], lda, &a[*k + i + i * a_dim1], &c__1, &c_b1, &work[
		1], &c__1);
	i__2 = *n - *k - i + 1;
	i__3 = *k - 1;
	z__1.r = -tau.r, z__1.i = -tau.i;
	zgerc_(&i__2, &i__3, &z__1, &a[*k + i + i * a_dim1], &c__1, &work[1], 
		&c__1, &a[*k + i + (i + 1) * a_dim1], lda);

/*        apply reflection to A(k+i:n,k+i:n) from the left and the rig
ht   

          compute  y := tau * A * conjg(u) */

	i__2 = *n - *k - i + 1;
	zlacgv_slu(&i__2, &a[*k + i + i * a_dim1], &c__1);
	i__2 = *n - *k - i + 1;
	zsymv_("Lower", &i__2, &tau, &a[*k + i + (*k + i) * a_dim1], lda, &a[*
		k + i + i * a_dim1], &c__1, &c_b1, &work[1], &c__1);
	i__2 = *n - *k - i + 1;
	zlacgv_slu(&i__2, &a[*k + i + i * a_dim1], &c__1);

/*        compute  v := y - 1/2 * tau * ( u, y ) * u */

	z__3.r = -.5, z__3.i = 0.;
	z__2.r = z__3.r * tau.r - z__3.i * tau.i, z__2.i = z__3.r * tau.i + 
		z__3.i * tau.r;
	i__2 = *n - *k - i + 1;
	zdotc_(&z__4, &i__2, &a[*k + i + i * a_dim1], &c__1, &work[1], &c__1);
	z__1.r = z__2.r * z__4.r - z__2.i * z__4.i, z__1.i = z__2.r * z__4.i 
		+ z__2.i * z__4.r;
	alpha.r = z__1.r, alpha.i = z__1.i;
	i__2 = *n - *k - i + 1;
	zaxpy_(&i__2, &alpha, &a[*k + i + i * a_dim1], &c__1, &work[1], &c__1)
		;

/*        apply symmetric rank-2 update to A(k+i:n,k+i:n)   

          CALL ZSYR2( 'Lower', N-K-I+1, -ONE, A( K+I, I ), 1, WORK, 1,
   
          $               A( K+I, K+I ), LDA ) */

	i__2 = *n;
	for (jj = *k + i; jj <= i__2; ++jj) {
	    i__3 = *n;
	    for (ii = jj; ii <= i__3; ++ii) {
		i__4 = ii + jj * a_dim1;
		i__5 = ii + jj * a_dim1;
		i__6 = ii + i * a_dim1;
		i__7 = jj - *k - i + 1;
		z__3.r = a[i__6].r * work[i__7].r - a[i__6].i * work[i__7].i, 
			z__3.i = a[i__6].r * work[i__7].i + a[i__6].i * work[
			i__7].r;
		z__2.r = a[i__5].r - z__3.r, z__2.i = a[i__5].i - z__3.i;
		i__8 = ii - *k - i + 1;
		i__9 = jj + i * a_dim1;
		z__4.r = work[i__8].r * a[i__9].r - work[i__8].i * a[i__9].i, 
			z__4.i = work[i__8].r * a[i__9].i + work[i__8].i * a[
			i__9].r;
		z__1.r = z__2.r - z__4.r, z__1.i = z__2.i - z__4.i;
		a[i__4].r = z__1.r, a[i__4].i = z__1.i;
/* L70: */
	    }
/* L80: */
	}

	i__2 = *k + i + i * a_dim1;
	z__1.r = -wa.r, z__1.i = -wa.i;
	a[i__2].r = z__1.r, a[i__2].i = z__1.i;
	i__2 = *n;
	for (j = *k + i + 1; j <= i__2; ++j) {
	    i__3 = j + i * a_dim1;
	    a[i__3].r = 0., a[i__3].i = 0.;
/* L90: */
	}
/* L100: */
    }

/*     Store full symmetric matrix */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *n;
	for (i = j + 1; i <= i__2; ++i) {
	    i__3 = j + i * a_dim1;
	    i__4 = i + j * a_dim1;
	    a[i__3].r = a[i__4].r, a[i__3].i = a[i__4].i;
/* L110: */
	}
/* L120: */
    }
    return 0;

/*     End of ZLAGSY */

}